

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

FloatImageTexture * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,TextureMapping2DHandle *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          MIPMapFilterOptions *args_2,WrapMode *args_3,float *args_4,bool *args_5,
          ColorEncodingHandle *args_6,polymorphic_allocator<std::byte> *args_7)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x18,8);
  construct<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (this,(FloatImageTexture *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,args_4
             ,args_5,args_6,args_7);
  return (FloatImageTexture *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }